

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

_Bool is_layer_affine(dbg_layer_t layer)

{
  ushort uVar1;
  
  uVar1 = (ppu->DISPCNT).raw & 7;
  if (uVar1 == 2) {
    layer = layer & ~BG1;
  }
  else if (uVar1 != 1) {
    return false;
  }
  return layer == BG2;
}

Assistant:

bool is_layer_affine(dbg_layer_t layer) {
    switch (ppu->DISPCNT.mode) {
        case 0:
            return false;
        case 1:
            return layer == BG2;
        case 2:
            return layer == BG2 || layer == BG3;
        default:
            return false;
    }
}